

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

If_DsdMan_t * If_DsdManLoad(char *pFileName)

{
  Vec_Mem_t *p;
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  FILE *pFVar3;
  If_DsdMan_t *p_00;
  size_t sVar4;
  void *pvVar5;
  void **ppvVar6;
  int *piVar7;
  uint *puVar8;
  uint *puVar9;
  word *pwVar10;
  Vec_Wrd_t *pVVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  char *pcVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  int Num;
  int Num2;
  char pBuffer [10];
  uint local_68;
  uint local_64;
  FILE *local_60;
  int local_54;
  ulong local_50;
  If_DsdMan_t *local_48;
  int local_3a [2];
  
  pFVar3 = fopen(pFileName,"rb");
  if (pFVar3 == (FILE *)0x0) {
    pcVar15 = "Reading DSD manager file \"%s\" has failed.\n";
LAB_0038ec9d:
    printf(pcVar15,pFileName);
    return (If_DsdMan_t *)0x0;
  }
  fread(local_3a,4,1,pFVar3);
  if (local_3a[0] != 0x31647364) {
    pcVar15 = "Unrecognized format of file \"%s\".\n";
    goto LAB_0038ec9d;
  }
  fread(&local_68,4,1,pFVar3);
  p_00 = If_DsdManAlloc(local_68,0);
  if (p_00->pStore != (char *)0x0) {
    free(p_00->pStore);
    p_00->pStore = (char *)0x0;
  }
  local_60 = pFVar3;
  if (pFileName == (char *)0x0) {
    pcVar15 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pFileName);
    pcVar15 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar15,pFileName);
  }
  pFVar3 = local_60;
  p_00->pStore = pcVar15;
  fread(&local_68,4,1,local_60);
  p_00->LutSize = local_68;
  pvVar5 = If_ManSatBuildXY(local_68);
  p_00->pSat = pvVar5;
  fread(&local_68,4,1,pFVar3);
  uVar16 = local_68;
  lVar19 = (long)(int)local_68;
  if (lVar19 < 2) {
    __assert_fail("Num >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                  ,0x46f,"If_DsdMan_t *If_DsdManLoad(char *)");
  }
  iVar14 = (p_00->vObjs).nSize;
  if (iVar14 < (int)local_68) {
    iVar13 = (p_00->vObjs).nCap;
    uVar2 = iVar13 * 2;
    if ((int)uVar2 < (int)local_68) {
      if (iVar13 < (int)local_68) {
        ppvVar6 = (p_00->vObjs).pArray;
        if (ppvVar6 == (void **)0x0) {
          ppvVar6 = (void **)malloc(lVar19 * 8);
        }
        else {
          ppvVar6 = (void **)realloc(ppvVar6,lVar19 * 8);
        }
        (p_00->vObjs).pArray = ppvVar6;
        uVar2 = uVar16;
LAB_0038ede5:
        (p_00->vObjs).nCap = uVar2;
      }
    }
    else if (SBORROW4(iVar13,uVar2) != 0 < iVar13 && iVar13 < (int)local_68) {
      ppvVar6 = (p_00->vObjs).pArray;
      if (ppvVar6 == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar2 << 3);
      }
      else {
        ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar2 << 3);
      }
      (p_00->vObjs).pArray = ppvVar6;
      goto LAB_0038ede5;
    }
    memset((p_00->vObjs).pArray + iVar14,0,(lVar19 - iVar14) * 8);
    (p_00->vObjs).nSize = uVar16;
  }
  pFVar3 = local_60;
  if ((p_00->vNexts).nCap < (int)uVar16) {
    piVar7 = (p_00->vNexts).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc(lVar19 * 4);
    }
    else {
      piVar7 = (int *)realloc(piVar7,lVar19 * 4);
    }
    (p_00->vNexts).pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_0038f44b;
    (p_00->vNexts).nCap = uVar16;
  }
  sVar4 = lVar19 << 2;
  memset((p_00->vNexts).pArray,0,sVar4);
  (p_00->vNexts).nSize = uVar16;
  if ((p_00->vTruths).nCap < (int)uVar16) {
    piVar7 = (p_00->vTruths).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc(sVar4);
    }
    else {
      piVar7 = (int *)realloc(piVar7,sVar4);
    }
    (p_00->vTruths).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
LAB_0038f44b:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p_00->vTruths).nCap = uVar16;
  }
  memset((p_00->vTruths).pArray,0xff,sVar4);
  (p_00->vTruths).nSize = uVar16;
  uVar16 = uVar16 * 2 - 1;
  while( true ) {
    do {
      uVar12 = uVar16 + 1;
      uVar2 = uVar16 & 1;
      uVar16 = uVar12;
    } while (uVar2 != 0);
    if (uVar12 < 9) break;
    iVar14 = 5;
    while (uVar12 % (iVar14 - 2U) != 0) {
      uVar2 = iVar14 * iVar14;
      iVar14 = iVar14 + 2;
      if (uVar12 < uVar2) goto LAB_0038eed6;
    }
  }
LAB_0038eed6:
  p_00->nBins = uVar12;
  sVar4 = (long)(int)uVar12 << 2;
  if (p_00->pBins == (uint *)0x0) {
    puVar8 = (uint *)malloc(sVar4);
  }
  else {
    puVar8 = (uint *)realloc(p_00->pBins,sVar4);
  }
  p_00->pBins = puVar8;
  memset(puVar8,0,sVar4);
  iVar14 = (p_00->vObjs).nSize;
  if (2 < iVar14) {
    lVar19 = 2;
    do {
      fread(&local_68,4,1,pFVar3);
      lVar17 = (long)(int)local_68;
      puVar8 = (uint *)Mem_FlexEntryFetch(p_00->pMem,local_68 * 8);
      fread(puVar8,lVar17 << 3,1,pFVar3);
      (p_00->vObjs).pArray[lVar19] = puVar8;
      if ((puVar8[1] & 7) == 6) {
        fread(&local_68,4,1,local_60);
        if ((p_00->vTruths).nSize <= lVar19) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p_00->vTruths).pArray[lVar19] = local_68;
      }
      uVar16 = puVar8[1];
      iVar14 = -1;
      if (0x17ffffff < uVar16 && (uVar16 & 7) == 6) {
        uVar2 = *puVar8;
        if (((long)(int)uVar2 < 0) || ((p_00->vTruths).nSize <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar14 = (p_00->vTruths).pArray[(int)uVar2];
      }
      puVar9 = If_DsdObjHashLookup(p_00,uVar16 & 7,(int *)(puVar8 + 2),uVar16 >> 0x1b,iVar14);
      if (*puVar9 != 0) {
        __assert_fail("*pSpot == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                      ,0x482,"If_DsdMan_t *If_DsdManLoad(char *)");
      }
      *puVar9 = *puVar8;
      lVar19 = lVar19 + 1;
      iVar14 = (p_00->vObjs).nSize;
      pFVar3 = local_60;
    } while (lVar19 < iVar14);
  }
  if (p_00->nUniqueMisses != iVar14 + -2) {
    __assert_fail("p->nUniqueMisses == Vec_PtrSize(&p->vObjs) - 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                  ,0x485,"If_DsdMan_t *If_DsdManLoad(char *)");
  }
  p_00->nUniqueMisses = 0;
  pwVar10 = (word *)malloc((long)p_00->nWords << 3);
  local_50 = (ulong)(uint)p_00->nVars;
  if (2 < p_00->nVars) {
    local_50 = local_50 + 1;
    uVar18 = 3;
    local_48 = p_00;
    do {
      p = local_48->vTtMem[uVar18];
      iVar14 = p->nEntrySize;
      fread(&local_68,4,1,pFVar3);
      local_64 = local_68;
      if (0 < (int)local_68) {
        uVar16 = local_68;
        do {
          fread(pwVar10,(long)(iVar14 << 3),1,pFVar3);
          Vec_MemHashInsert(p,pwVar10);
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      pFVar3 = local_60;
      if (local_64 != p->nEntries) {
        __assert_fail("Num == Vec_MemEntryNum(p->vTtMem[v])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                      ,0x491,"If_DsdMan_t *If_DsdManLoad(char *)");
      }
      fread(&local_54,4,1,local_60);
      local_64 = local_54;
      iVar14 = local_54;
      if (0 < local_54) {
        do {
          fread(&local_68,4,1,pFVar3);
          uVar16 = local_68;
          puVar8 = (uint *)malloc(0x10);
          uVar2 = uVar16;
          if (uVar16 - 1 < 0xf) {
            uVar2 = 0x10;
          }
          puVar8[1] = 0;
          *puVar8 = uVar2;
          if (uVar2 == 0) {
            pvVar5 = (void *)0x0;
          }
          else {
            pvVar5 = malloc((long)(int)uVar2 << 2);
          }
          *(void **)(puVar8 + 2) = pvVar5;
          fread(pvVar5,(long)(int)uVar16 << 2,1,pFVar3);
          puVar8[1] = uVar16;
          pVVar1 = local_48->vTtDecs[uVar18];
          uVar16 = pVVar1->nCap;
          if (pVVar1->nSize == uVar16) {
            if ((int)uVar16 < 0x10) {
              if (pVVar1->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar1->pArray,0x80);
              }
              pVVar1->pArray = ppvVar6;
              iVar13 = 0x10;
            }
            else {
              iVar13 = uVar16 * 2;
              if (iVar13 <= (int)uVar16) goto LAB_0038f1ee;
              if (pVVar1->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar16 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar1->pArray,(ulong)uVar16 << 4);
              }
              pVVar1->pArray = ppvVar6;
            }
            pVVar1->nCap = iVar13;
          }
LAB_0038f1ee:
          iVar13 = pVVar1->nSize;
          pVVar1->nSize = iVar13 + 1;
          pVVar1->pArray[iVar13] = puVar8;
          iVar14 = iVar14 + -1;
          pFVar3 = local_60;
        } while (iVar14 != 0);
      }
      if (local_64 != local_48->vTtDecs[uVar18]->nSize) {
        __assert_fail("Num2 == Vec_PtrSize(p->vTtDecs[v])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                      ,0x49b,"If_DsdMan_t *If_DsdManLoad(char *)");
      }
      uVar18 = uVar18 + 1;
      p_00 = local_48;
    } while (uVar18 != local_50);
  }
  if (pwVar10 != (word *)0x0) {
    free(pwVar10);
  }
  fread(&local_68,4,1,pFVar3);
  p_00->nConfigWords = local_68;
  fread(&local_68,4,1,pFVar3);
  p_00->nTtBits = local_68;
  sVar4 = fread(&local_68,4,1,pFVar3);
  uVar16 = local_68;
  if (local_68 != 0 && (int)sVar4 != 0) {
    lVar19 = (long)(int)local_68;
    pVVar11 = (Vec_Wrd_t *)malloc(0x10);
    uVar2 = 0x10;
    if (0x10 < uVar16) {
      uVar2 = uVar16;
    }
    pVVar11->nSize = 0;
    pVVar11->nCap = uVar2;
    pwVar10 = (word *)malloc((long)(int)uVar2 << 3);
    pVVar11->pArray = pwVar10;
    pVVar11->nSize = uVar16;
    memset(pwVar10,0,lVar19 << 3);
    pFVar3 = local_60;
    p_00->vConfigs = pVVar11;
    fread(pwVar10,lVar19 << 3,1,local_60);
  }
  sVar4 = fread(&local_68,4,1,pFVar3);
  if (local_68 != 0 && (int)sVar4 != 0) {
    pcVar15 = (char *)calloc((long)(int)local_68 + 1,1);
    p_00->pCellStr = pcVar15;
    fread(pcVar15,(long)(int)local_68,1,pFVar3);
  }
  fclose(pFVar3);
  return p_00;
}

Assistant:

If_DsdMan_t * If_DsdManLoad( char * pFileName )
{
    If_DsdMan_t * p;
    If_DsdObj_t * pObj; 
    Vec_Int_t * vSets;
    char pBuffer[10];
    unsigned * pSpot;
    word * pTruth;
    int i, v, Num, Num2, RetValue;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Reading DSD manager file \"%s\" has failed.\n", pFileName );
        return NULL;
    }
    RetValue = fread( pBuffer, 4, 1, pFile );
    if ( strncmp(pBuffer, DSD_VERSION, strlen(DSD_VERSION)) )
    {
        printf( "Unrecognized format of file \"%s\".\n", pFileName );
        return NULL;
    }
    RetValue = fread( &Num, 4, 1, pFile );
    p = If_DsdManAlloc( Num, 0 );
    ABC_FREE( p->pStore );
    p->pStore = Abc_UtilStrsav( pFileName );
    RetValue = fread( &Num, 4, 1, pFile );
    p->LutSize = Num;
    p->pSat  = If_ManSatBuildXY( p->LutSize );
    RetValue = fread( &Num, 4, 1, pFile );
    assert( Num >= 2 );
    Vec_PtrFillExtra( &p->vObjs, Num, NULL );
    Vec_IntFill( &p->vNexts, Num, 0 );
    Vec_IntFill( &p->vTruths, Num, -1 );
    p->nBins = Abc_PrimeCudd( 2*Num );
    p->pBins = ABC_REALLOC( unsigned, p->pBins, p->nBins );
    memset( p->pBins, 0, sizeof(unsigned) * p->nBins );
    for ( i = 2; i < Vec_PtrSize(&p->vObjs); i++ )
    {
        RetValue = fread( &Num, 4, 1, pFile );
        pObj = (If_DsdObj_t *)Mem_FlexEntryFetch( p->pMem, sizeof(word) * Num );
        RetValue = fread( pObj, sizeof(word)*Num, 1, pFile );
        Vec_PtrWriteEntry( &p->vObjs, i, pObj );
        if ( pObj->Type == IF_DSD_PRIME )
        {
            RetValue = fread( &Num, 4, 1, pFile );
            Vec_IntWriteEntry( &p->vTruths, i, Num );
        }
        pSpot = If_DsdObjHashLookup( p, pObj->Type, (int *)pObj->pFans, pObj->nFans, If_DsdObjTruthId(p, pObj) );
        assert( *pSpot == 0 );
        *pSpot = pObj->Id;
    }
    assert( p->nUniqueMisses == Vec_PtrSize(&p->vObjs) - 2 );
    p->nUniqueMisses = 0;
    pTruth = ABC_ALLOC( word, p->nWords );
    for ( v = 3; v <= p->nVars; v++ )
    {
        int nBytes = sizeof(word)*Vec_MemEntrySize(p->vTtMem[v]);
        RetValue = fread( &Num, 4, 1, pFile );
        for ( i = 0; i < Num; i++ )
        {
            RetValue = fread( pTruth, nBytes, 1, pFile );
            Vec_MemHashInsert( p->vTtMem[v], pTruth );
        }
        assert( Num == Vec_MemEntryNum(p->vTtMem[v]) );
        RetValue = fread( &Num2, 4, 1, pFile );
        for ( i = 0; i < Num2; i++ )
        {
            RetValue = fread( &Num, 4, 1, pFile );
            vSets = Vec_IntAlloc( Num );
            RetValue = fread( Vec_IntArray(vSets), sizeof(int)*Num, 1, pFile );
            vSets->nSize = Num;
            Vec_PtrPush( p->vTtDecs[v], vSets );
        }
        assert( Num2 == Vec_PtrSize(p->vTtDecs[v]) ); 
    }
    ABC_FREE( pTruth );
    RetValue = fread( &Num, 4, 1, pFile );
    p->nConfigWords = Num;
    RetValue = fread( &Num, 4, 1, pFile );
    p->nTtBits = Num;
    RetValue = fread( &Num, 4, 1, pFile );
    if ( RetValue && Num )
    {
        p->vConfigs = Vec_WrdStart( Num );
        RetValue = fread( Vec_WrdArray(p->vConfigs), sizeof(word)*Num, 1, pFile );
    }
    RetValue = fread( &Num, 4, 1, pFile );
    if ( RetValue && Num )
    {
        p->pCellStr = ABC_CALLOC( char, Num + 1 );
        RetValue = fread( p->pCellStr, sizeof(char)*Num, 1, pFile );
    }
    fclose( pFile );
    return p;
}